

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool __thiscall ImGuiTextFilter::PassFilter(ImGuiTextFilter *this,char *text,char *text_end)

{
  uint uVar1;
  ImGuiTextRange *pIVar2;
  char *needle_end;
  bool bVar3;
  byte in_AL;
  char *pcVar4;
  ulong uVar5;
  long lVar6;
  char *haystack;
  bool bVar7;
  
  uVar1 = (this->Filters).Size;
  if ((ulong)uVar1 == 0) {
    in_AL = 1;
  }
  else {
    haystack = "";
    if (text != (char *)0x0) {
      haystack = text;
    }
    lVar6 = 0;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    pIVar2 = (this->Filters).Data;
    bVar7 = false;
    do {
      if (uVar5 * 0x10 == lVar6) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.h"
                      ,0x504,
                      "const T &ImVector<ImGuiTextFilter::ImGuiTextRange>::operator[](int) const [T = ImGuiTextFilter::ImGuiTextRange]"
                     );
      }
      pcVar4 = *(char **)((long)&pIVar2->b + lVar6);
      needle_end = *(char **)((long)&pIVar2->e + lVar6);
      if (pcVar4 == needle_end) {
        bVar3 = false;
      }
      else if (*pcVar4 == '-') {
        pcVar4 = ImStristr(haystack,text_end,pcVar4 + 1,needle_end);
        if (pcVar4 == (char *)0x0) {
LAB_001d4228:
          bVar3 = false;
        }
        else {
          bVar3 = true;
          in_AL = 0;
        }
      }
      else {
        pcVar4 = ImStristr(haystack,text_end,pcVar4,needle_end);
        if (pcVar4 == (char *)0x0) goto LAB_001d4228;
        in_AL = 1;
        bVar3 = true;
      }
      if (bVar3) break;
      lVar6 = lVar6 + 0x10;
      bVar7 = (ulong)uVar1 << 4 == lVar6;
    } while (!bVar7);
    if (bVar7) {
      in_AL = this->CountGrep == 0;
    }
  }
  return (bool)(in_AL & 1);
}

Assistant:

bool ImGuiTextFilter::PassFilter(const char* text, const char* text_end) const
{
    if (Filters.empty())
        return true;

    if (text == NULL)
        text = "";

    for (int i = 0; i != Filters.Size; i++)
    {
        const ImGuiTextRange& f = Filters[i];
        if (f.empty())
            continue;
        if (f.b[0] == '-')
        {
            // Subtract
            if (ImStristr(text, text_end, f.b + 1, f.e) != NULL)
                return false;
        }
        else
        {
            // Grep
            if (ImStristr(text, text_end, f.b, f.e) != NULL)
                return true;
        }
    }

    // Implicit * grep
    if (CountGrep == 0)
        return true;

    return false;
}